

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ToolBar::_q_rightArrowClicked(ToolBar *this)

{
  int iVar1;
  ToolBarPrivate *pTVar2;
  ToolBarLayout *pTVar3;
  int iVar4;
  
  pTVar2 = (this->d).d;
  pTVar3 = pTVar2->layout;
  iVar1 = (&(pTVar2->iconSize).wd)[pTVar3->orient != Horizontal];
  iVar4 = (**(code **)(*(long *)pTVar3 + 0x60))();
  ToolBarLayout::setOffset(((this->d).d)->layout,iVar1 + iVar4);
  QWidget::update();
  return;
}

Assistant:

void
ToolBar::_q_rightArrowClicked()
{
	int delta = 0;

	if( d->layout->orientation() == Qt::Horizontal )
		delta = d->iconSize.width() + d->layout->spacing();
	else
		delta = d->iconSize.height() + d->layout->spacing();

	d->layout->setOffset( delta );

	update();
}